

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O2

bool __thiscall
absl::lts_20240722::str_format_internal::anon_unknown_3::ArgContext::Bind
          (ArgContext *this,UnboundConversion *unbound,BoundConversion *bound)

{
  bool bVar1;
  uint uVar2;
  reference pFVar3;
  Flags FVar4;
  size_type i;
  size_type in_R8;
  Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl> pack;
  Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl> pack_00;
  int width;
  int precision;
  uint local_30;
  int local_2c;
  
  i = (long)unbound->arg_position - 1;
  if (i < (this->pack_).len_) {
    pFVar3 = Span<const_absl::lts_20240722::str_format_internal::FormatArgImpl>::operator[]
                       (&this->pack_,i);
    if (unbound->flags == kBasic) {
      (bound->super_FormatConversionSpecImpl).flags_ = kBasic;
      (bound->super_FormatConversionSpecImpl).width_ = -1;
      (bound->super_FormatConversionSpecImpl).precision_ = -1;
    }
    else {
      local_30 = (unbound->width).value_;
      if ((int)local_30 < -1) {
        uVar2 = UnboundConversion::InputValue::get_from_arg(&unbound->width);
        pack.len_ = in_R8;
        pack.ptr_ = (pointer)(this->pack_).len_;
        bVar1 = BindFromPosition((anon_unknown_3 *)(ulong)uVar2,(int)&local_30,
                                 (int *)(this->pack_).ptr_,pack);
        if (!bVar1) goto LAB_0010d623;
        if (-1 < (int)local_30) goto LAB_0010d5d3;
        uVar2 = 0x80000001;
        if (0x80000001 < local_30) {
          uVar2 = local_30;
        }
        local_30 = -uVar2;
        FVar4 = kLeft;
      }
      else {
LAB_0010d5d3:
        FVar4 = kBasic;
      }
      local_2c = (unbound->precision).value_;
      if (local_2c < -1) {
        uVar2 = UnboundConversion::InputValue::get_from_arg(&unbound->precision);
        pack_00.len_ = in_R8;
        pack_00.ptr_ = (pointer)(this->pack_).len_;
        bVar1 = BindFromPosition((anon_unknown_3 *)(ulong)uVar2,(int)&local_2c,
                                 (int *)(this->pack_).ptr_,pack_00);
        if (!bVar1) goto LAB_0010d623;
      }
      (bound->super_FormatConversionSpecImpl).width_ = local_30;
      (bound->super_FormatConversionSpecImpl).precision_ = local_2c;
      (bound->super_FormatConversionSpecImpl).flags_ = FVar4 | unbound->flags;
      (bound->super_FormatConversionSpecImpl).length_mod_ = unbound->length_mod;
    }
    (bound->super_FormatConversionSpecImpl).conv_ = unbound->conv;
    bound->arg_ = pFVar3;
    bVar1 = true;
  }
  else {
LAB_0010d623:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool ArgContext::Bind(const UnboundConversion* unbound,
                             BoundConversion* bound) {
  const FormatArgImpl* arg = nullptr;
  int arg_position = unbound->arg_position;
  if (static_cast<size_t>(arg_position - 1) >= pack_.size()) return false;
  arg = &pack_[static_cast<size_t>(arg_position - 1)];  // 1-based

  if (unbound->flags != Flags::kBasic) {
    int width = unbound->width.value();
    bool force_left = false;
    if (unbound->width.is_from_arg()) {
      if (!BindFromPosition(unbound->width.get_from_arg(), &width, pack_))
        return false;
      if (width < 0) {
        // "A negative field width is taken as a '-' flag followed by a
        // positive field width."
        force_left = true;
        // Make sure we don't overflow the width when negating it.
        width = -std::max(width, -std::numeric_limits<int>::max());
      }
    }

    int precision = unbound->precision.value();
    if (unbound->precision.is_from_arg()) {
      if (!BindFromPosition(unbound->precision.get_from_arg(), &precision,
                            pack_))
        return false;
    }

    FormatConversionSpecImplFriend::SetWidth(width, bound);
    FormatConversionSpecImplFriend::SetPrecision(precision, bound);

    if (force_left) {
      FormatConversionSpecImplFriend::SetFlags(unbound->flags | Flags::kLeft,
                                               bound);
    } else {
      FormatConversionSpecImplFriend::SetFlags(unbound->flags, bound);
    }

    FormatConversionSpecImplFriend::SetLengthMod(unbound->length_mod, bound);
  } else {
    FormatConversionSpecImplFriend::SetFlags(unbound->flags, bound);
    FormatConversionSpecImplFriend::SetWidth(-1, bound);
    FormatConversionSpecImplFriend::SetPrecision(-1, bound);
  }
  FormatConversionSpecImplFriend::SetConversionChar(unbound->conv, bound);
  bound->set_arg(arg);
  return true;
}